

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
SerialSimulationDataGenerator::GenerateSimulationData
          (SerialSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U64 value;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint local_40;
  uint local_3c;
  U32 i_1;
  U32 i;
  U64 address;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  SerialSimulationDataGenerator *this_local;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while (uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber(), uVar3 < uVar2) {
    iVar1 = (int)this;
    if (this->mSettings->mSerialMode == Normal) {
      value = this->mValue;
      this->mValue = value + 1;
      CreateSerialByte(this,value);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x40);
    }
    else {
      CreateSerialByte(this,this->mMpModeAddressMask | 1);
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        ClockGenerator::AdvanceByHalfPeriod(2.0);
        SimulationChannelDescriptor::Advance(iVar1 + 0x40);
        uVar3 = this->mValue;
        this->mValue = uVar3 + 1;
        CreateSerialByte(this,uVar3 & this->mNumBitsMask | this->mMpModeDataMask);
      }
      ClockGenerator::AdvanceByHalfPeriod(20.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x40);
      CreateSerialByte(this,this->mMpModeAddressMask | 2);
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        ClockGenerator::AdvanceByHalfPeriod(2.0);
        SimulationChannelDescriptor::Advance(iVar1 + 0x40);
        uVar3 = this->mValue;
        this->mValue = uVar3 + 1;
        CreateSerialByte(this,uVar3 & this->mNumBitsMask | this->mMpModeDataMask);
      }
      ClockGenerator::AdvanceByHalfPeriod(20.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x40);
    }
  }
  *simulation_channels = &this->mSerialSimulationData;
  return 1;
}

Assistant:

U32 SerialSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                           SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mSerialSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        if( mSettings->mSerialMode == SerialAnalyzerEnums::Normal )
        {
            CreateSerialByte( mValue++ );

            mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }
        else
        {
            U64 address = 0x1 | mMpModeAddressMask;
            CreateSerialByte( address );

            for( U32 i = 0; i < 4; i++ )
            {
                mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) ); // insert 2 bit-periods of idle
                CreateSerialByte( ( mValue++ & mNumBitsMask ) | mMpModeDataMask );
            }

            mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 20 bit-periods of idle

            address = 0x2 | mMpModeAddressMask;
            CreateSerialByte( address );

            for( U32 i = 0; i < 4; i++ )
            {
                mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) ); // insert 2 bit-periods of idle
                CreateSerialByte( ( mValue++ & mNumBitsMask ) | mMpModeDataMask );
            }

            mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 20 bit-periods of idle
        }
    }

    *simulation_channels = &mSerialSimulationData;


    return 1; // we are retuning the size of the SimulationChannelDescriptor array.  In our case, the "array" is length 1.
}